

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriterTests.cpp
# Opt level: O2

string * readFileAndDelete_abi_cxx11_(string *__return_storage_ptr__,char *fileName)

{
  stringstream written;
  undefined1 local_390 [376];
  ifstream in;
  streambuf local_208 [504];
  
  std::ifstream::ifstream(&in,fileName,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&written);
  std::ostream::operator<<(local_390,local_208);
  std::ifstream::close();
  remove(fileName);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&written);
  std::ifstream::~ifstream(&in);
  return __return_storage_ptr__;
}

Assistant:

std::string readFileAndDelete(const char* fileName)
{
    std::ifstream in(fileName, std::ios_base::in);
    std::stringstream written;
    written << in.rdbuf();
    in.close();
    remove(fileName);

    std::string text = written.str();
    return text;
}